

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

InputSlot * __thiscall QPlatformPrintDevice::defaultInputSlot(QPlatformPrintDevice *this)

{
  InputSlot *in_RDI;
  long in_FS_OFFSET;
  InputSlot *input;
  InputSlot *this_00;
  char local_50 [24];
  QArrayDataPointer<char> local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  memset(in_RDI,0xaa,0x38);
  QPrint::InputSlot::InputSlot(this_00);
  QArrayDataPointer<char>::QArrayDataPointer(local_38,(Data *)0x0,"Auto",4);
  QByteArray::QByteArray(&this_00->key,(DataPointer *)in_RDI);
  QByteArray::operator=(&this_00->key,&in_RDI->key);
  QByteArray::~QByteArray((QByteArray *)0x1327ec);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this_00);
  QCoreApplication::translate(local_50,"Print Device Input Slot","Automatic",0);
  QString::operator=((QString *)this_00,(QString *)in_RDI);
  QString::~QString((QString *)0x132835);
  this_00->id = Auto;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPrint::InputSlot QPlatformPrintDevice::defaultInputSlot() const
{
    QPrint::InputSlot input;
    input.key = QByteArrayLiteral("Auto");
    input.name = QCoreApplication::translate("Print Device Input Slot", "Automatic");
    input.id = QPrint::Auto;
    return input;
}